

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O0

string * convert<float>(float *x,size_t count,size_t stride)

{
  long in_RCX;
  ulong in_RDX;
  long in_RSI;
  string *in_RDI;
  size_t i;
  string *result;
  string local_60 [32];
  ulong local_40;
  allocator local_22;
  undefined1 local_21;
  long local_20;
  ulong local_18;
  long local_10;
  
  local_21 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"[",&local_22);
  std::allocator<char>::~allocator((allocator<char> *)&local_22);
  for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
    std::__cxx11::to_string((float)((ulong)in_RDI >> 0x20));
    std::__cxx11::string::operator+=((string *)in_RDI,local_60);
    std::__cxx11::string::~string(local_60);
    if (local_40 != local_18 - 1) {
      std::__cxx11::string::operator+=((string *)in_RDI,", ");
    }
    local_10 = local_10 + local_20;
  }
  std::__cxx11::string::operator+=((string *)in_RDI,"]");
  return in_RDI;
}

Assistant:

std::string convert(T* x, size_t count, size_t stride)
{
    std::string result = "[";
    for (size_t i = 0; i < count; ++i)
    {
        result += std::to_string(*x);
        if (i != count - 1)
            result += ", ";

        x = (T*) ((char*) x + stride);      // this is horribly ugly, but technically correct
    }
    result += "]";
    return result;
}